

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

Symbol * sym_Ref(char *symName)

{
  Symbol *pSVar1;
  char *in_RCX;
  char fullname [256];
  char acStack_118 [264];
  
  pSVar1 = sym_FindScopedSymbol(symName);
  if (pSVar1 == (Symbol *)0x0) {
    if (*symName == '.') {
      if (labelScope == (char *)0x0) {
        fatalerror("Local label reference \'%s\' in main scope\n",symName);
      }
      fullSymbolName(acStack_118,(size_t)symName,labelScope,in_RCX);
      symName = acStack_118;
    }
    pSVar1 = createsymbol(symName);
    pSVar1->type = SYM_REF;
  }
  return pSVar1;
}

Assistant:

struct Symbol *sym_Ref(char const *symName)
{
	struct Symbol *sym = sym_FindScopedSymbol(symName);

	if (!sym) {
		char fullname[MAXSYMLEN + 1];

		if (symName[0] == '.') {
			if (!labelScope)
				fatalerror("Local label reference '%s' in main scope\n", symName);
			fullSymbolName(fullname, sizeof(fullname), symName, labelScope);
			symName = fullname;
		}

		sym = createsymbol(symName);
		sym->type = SYM_REF;
	}

	return sym;
}